

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ilist_node.h
# Opt level: O1

void __thiscall spvtools::opt::Instruction::Instruction(Instruction *this,Instruction *that)

{
  pointer pIVar1;
  Instruction *i;
  pointer pIVar2;
  
  (this->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ = (Instruction *)0x0;
  (this->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ = (Instruction *)0x0;
  (this->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ = false;
  (this->super_IntrusiveNodeBase<spvtools::opt::Instruction>)._vptr_IntrusiveNodeBase =
       (_func_int **)&PTR__Instruction_00948898;
  this->context_ = that->context_;
  this->opcode_ = that->opcode_;
  this->has_type_id_ = that->has_type_id_;
  this->has_result_id_ = that->has_result_id_;
  this->unique_id_ = that->unique_id_;
  (this->operands_).
  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
  super__Vector_impl_data._M_start =
       (that->operands_).
       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->operands_).
  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (that->operands_).
       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->operands_).
  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (that->operands_).
       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (that->operands_).
  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (that->operands_).
  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (that->operands_).
  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->dbg_line_insts_).
  super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (that->dbg_line_insts_).
       super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->dbg_line_insts_).
  super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (that->dbg_line_insts_).
       super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (this->dbg_line_insts_).
  super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (that->dbg_line_insts_).
       super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (that->dbg_line_insts_).
  super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (that->dbg_line_insts_).
  super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (that->dbg_line_insts_).
  super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->dbg_scope_ = that->dbg_scope_;
  pIVar1 = (this->dbg_line_insts_).
           super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pIVar2 = (this->dbg_line_insts_).
                super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                ._M_impl.super__Vector_impl_data._M_start; pIVar2 != pIVar1; pIVar2 = pIVar2 + 1) {
    pIVar2->dbg_scope_ = that->dbg_scope_;
  }
  return;
}

Assistant:

inline IntrusiveNodeBase<NodeType>::IntrusiveNodeBase()
    : next_node_(nullptr), previous_node_(nullptr), is_sentinel_(false) {}